

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O3

uint * Dau_ReadFile(char *pFileName,int nSizeW)

{
  int iVar1;
  FILE *__stream;
  uint *__ptr;
  long lVar2;
  int level;
  long lVar3;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  __stream = fopen(pFileName,"rb");
  __ptr = (uint *)calloc((long)nSizeW,8);
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
  }
  else {
    fread(__ptr,8,(long)nSizeW,__stream);
    printf("Finished reading file \"%s\".\n",pFileName);
    fclose(__stream);
  }
  level = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","File reading");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  return __ptr;
}

Assistant:

unsigned * Dau_ReadFile( char * pFileName, int nSizeW )
{
    abctime clk = Abc_Clock();
    FILE * pFile = fopen( pFileName, "rb" );
    unsigned * p = (unsigned *)ABC_CALLOC(word, nSizeW);
    int RetValue = pFile ? fread( p, sizeof(word), nSizeW, pFile ) : 0;
    RetValue = 0;
    if ( pFile )
    {
        printf( "Finished reading file \"%s\".\n", pFileName );
        fclose( pFile );
    }
    else
        printf( "Cannot open input file \"%s\".\n", pFileName );
    Abc_PrintTime( 1, "File reading", Abc_Clock() - clk );
    return p;
}